

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O0

StringRef __thiscall llvm::ARM::getCanonicalArchName(ARM *this,StringRef Arch)

{
  StringRef SVar1;
  char cVar2;
  int iVar3;
  unsigned_long *puVar4;
  void *pvVar5;
  size_t sVar6;
  bool bVar7;
  bool local_501;
  StringRef local_4e0;
  size_t local_4d0;
  char *local_4c8;
  size_t local_4c0;
  char *local_4b8;
  char *local_4b0 [2];
  char *local_4a0 [2];
  void *local_490;
  unsigned_long local_488;
  char *local_480 [2];
  void *local_470;
  unsigned_long local_468;
  StringRef local_460;
  char *local_450 [2];
  char *local_440 [2];
  char *local_430 [2];
  char *local_420 [2];
  char *local_410;
  StringRef Error;
  StringRef A;
  size_t offset;
  StringRef Arch_local;
  char *local_3d0;
  void *local_3a8;
  unsigned_long local_3a0;
  char *local_398;
  size_t local_390;
  char *local_388;
  size_t local_380;
  void *local_378;
  unsigned_long local_370;
  char *local_368;
  char **local_360;
  char *local_358;
  char **local_350;
  char *local_348;
  char **local_340;
  char *local_338;
  char **local_330;
  char *local_328;
  char **local_320;
  char *local_318;
  StringRef *local_310;
  char *local_308;
  char **local_300;
  char *local_2f8;
  char **local_2f0;
  char *local_2e8;
  char **local_2e0;
  char *local_2d8;
  StringRef *local_2d0;
  size_t *local_2c8;
  char *local_2c0;
  char *local_2b8;
  size_t *local_2b0;
  char *local_2a8;
  char *local_2a0;
  size_t *local_298;
  char *local_290;
  char *local_288;
  size_t *local_280;
  char *local_278;
  char *local_270;
  unsigned_long local_268 [2];
  size_t local_258;
  size_t *local_250;
  undefined1 local_248 [16];
  unsigned_long local_238;
  char *local_230;
  unsigned_long local_228;
  size_t *local_220;
  undefined1 local_218 [16];
  unsigned_long local_208 [2];
  size_t local_1f8;
  size_t *local_1f0;
  undefined1 local_1e8 [16];
  unsigned_long local_1d8 [2];
  size_t local_1c8;
  size_t *local_1c0;
  undefined1 local_1b8 [16];
  size_t *local_1a8;
  size_t *local_1a0;
  size_t *local_198;
  char *local_190;
  char *local_188;
  size_t *local_180;
  unsigned_long local_178;
  void *local_170;
  undefined1 *local_168;
  unsigned_long local_160;
  void *local_158;
  undefined1 *local_150;
  char *local_148;
  size_t local_140;
  undefined1 *local_138;
  char *local_130;
  size_t local_128;
  undefined1 *local_120;
  void **local_118;
  char *local_110;
  size_t local_108;
  void **local_100;
  char *local_f8;
  size_t local_f0;
  size_t local_e8;
  char *local_e0;
  void *local_d8;
  int local_cc;
  size_t local_c8;
  char *local_c0;
  void *local_b8;
  int local_ac;
  char *local_a8;
  char *local_a0;
  iterator local_98;
  int local_8c;
  char *local_88;
  char *local_80;
  size_t local_78;
  int local_6c;
  char *local_68;
  char *local_60;
  size_t local_58;
  int local_4c;
  char *local_48;
  char *local_40;
  size_t local_38;
  int local_2c;
  char *local_28;
  char *local_20;
  size_t local_18;
  int local_c;
  
  local_3d0 = Arch.Data;
  A.Length = 0xffffffffffffffff;
  local_360 = &local_410;
  local_368 = "";
  local_410 = "";
  Error.Length = (size_t)this;
  A.Data = local_3d0;
  Error.Data = (char *)strlen("");
  local_350 = local_420;
  local_358 = "arm64";
  local_420[0] = "arm64";
  local_270 = (char *)strlen("arm64");
  local_278 = local_420[0];
  local_280 = &Error.Length;
  local_501 = false;
  if (local_270 <= A.Data) {
    local_78 = Error.Length;
    local_80 = local_420[0];
    local_88 = local_270;
    if (local_270 == (char *)0x0) {
      local_6c = 0;
    }
    else {
      local_6c = memcmp((void *)Error.Length,local_420[0],(size_t)local_270);
    }
    local_501 = local_6c == 0;
  }
  if (local_501) {
    A.Length = 5;
  }
  else {
    local_340 = local_430;
    local_348 = "arm";
    local_430[0] = "arm";
    local_288 = (char *)strlen("arm");
    local_290 = local_430[0];
    local_298 = &Error.Length;
    bVar7 = false;
    if (local_288 <= A.Data) {
      local_58 = Error.Length;
      local_60 = local_430[0];
      local_68 = local_288;
      if (local_288 == (char *)0x0) {
        local_4c = 0;
      }
      else {
        local_4c = memcmp((void *)Error.Length,local_430[0],(size_t)local_288);
      }
      bVar7 = local_4c == 0;
    }
    if (bVar7) {
      A.Length = 3;
    }
    else {
      local_330 = local_440;
      local_338 = "thumb";
      local_440[0] = "thumb";
      local_2a0 = (char *)strlen("thumb");
      local_2a8 = local_440[0];
      local_2b0 = &Error.Length;
      bVar7 = false;
      if (local_2a0 <= A.Data) {
        local_38 = Error.Length;
        local_40 = local_440[0];
        local_48 = local_2a0;
        if (local_2a0 == (char *)0x0) {
          local_2c = 0;
        }
        else {
          local_2c = memcmp((void *)Error.Length,local_440[0],(size_t)local_2a0);
        }
        bVar7 = local_2c == 0;
      }
      if (bVar7) {
        A.Length = 5;
      }
      else {
        local_320 = local_450;
        local_328 = "aarch64";
        local_450[0] = "aarch64";
        local_2b8 = (char *)strlen("aarch64");
        local_2c0 = local_450[0];
        local_2c8 = &Error.Length;
        bVar7 = false;
        if (local_2b8 <= A.Data) {
          local_18 = Error.Length;
          local_20 = local_450[0];
          local_28 = local_2b8;
          if (local_2b8 == (char *)0x0) {
            local_c = 0;
          }
          else {
            local_c = memcmp((void *)Error.Length,local_450[0],(size_t)local_2b8);
          }
          bVar7 = local_c == 0;
        }
        if (bVar7) {
          A.Length = 7;
          local_310 = &local_460;
          local_318 = "eb";
          strlen("eb");
          sVar6 = StringRef::find((StringRef *)&Error.Length,local_460,0);
          if (sVar6 != 0xffffffffffffffff) {
            Arch_local.Length = (size_t)local_410;
            local_3d0 = Error.Data;
            goto LAB_002ac005;
          }
          local_1c0 = &Error.Length;
          local_1c8 = A.Length;
          local_1d8[1] = 3;
          puVar4 = std::min<unsigned_long>(&local_1c8,(unsigned_long *)&A);
          local_1c8 = *puVar4;
          pvVar5 = (void *)(Error.Length + local_1c8);
          local_1d8[0] = (long)A.Data - local_1c8;
          puVar4 = std::min<unsigned_long>(local_1d8 + 1,local_1d8);
          local_468 = *puVar4;
          local_168 = local_1b8;
          local_300 = local_480;
          local_308 = "_be";
          local_480[0] = "_be";
          local_470 = pvVar5;
          local_178 = local_468;
          local_170 = pvVar5;
          local_390 = strlen("_be");
          local_378 = local_470;
          local_370 = local_468;
          local_388 = local_480[0];
          local_398 = local_480[0];
          local_110 = local_480[0];
          local_118 = &local_378;
          bVar7 = false;
          local_380 = local_390;
          local_108 = local_390;
          if (local_468 == local_390) {
            local_b8 = local_470;
            local_c0 = local_480[0];
            local_c8 = local_390;
            if (local_390 == 0) {
              local_ac = 0;
            }
            else {
              local_ac = memcmp(local_470,local_480[0],local_390);
            }
            bVar7 = local_ac == 0;
          }
          if (bVar7) {
            A.Length = A.Length + 3;
          }
        }
      }
    }
  }
  bVar7 = false;
  if (A.Length != 0xffffffffffffffff) {
    local_1f0 = &Error.Length;
    local_1f8 = A.Length;
    local_208[1] = 2;
    puVar4 = std::min<unsigned_long>(&local_1f8,(unsigned_long *)&A);
    local_1f8 = *puVar4;
    pvVar5 = (void *)(Error.Length + local_1f8);
    local_208[0] = (long)A.Data - local_1f8;
    puVar4 = std::min<unsigned_long>(local_208 + 1,local_208);
    local_488 = *puVar4;
    local_150 = local_1e8;
    local_2f0 = local_4a0;
    local_2f8 = "eb";
    local_4a0[0] = "eb";
    local_490 = pvVar5;
    local_160 = local_488;
    local_158 = pvVar5;
    local_f0 = strlen("eb");
    local_3a8 = local_490;
    local_3a0 = local_488;
    local_f8 = local_4a0[0];
    local_100 = &local_3a8;
    bVar7 = false;
    if (local_488 == local_f0) {
      local_d8 = local_490;
      local_e0 = local_4a0[0];
      local_e8 = local_f0;
      if (local_f0 == 0) {
        local_cc = 0;
      }
      else {
        local_cc = memcmp(local_490,local_4a0[0],local_f0);
      }
      bVar7 = local_cc == 0;
    }
  }
  if (bVar7) {
    A.Length = A.Length + 2;
  }
  else {
    local_2e0 = local_4b0;
    local_2e8 = "eb";
    local_4b0[0] = "eb";
    local_188 = (char *)strlen("eb");
    local_190 = local_4b0[0];
    local_198 = &Error.Length;
    bVar7 = false;
    if (local_188 <= A.Data) {
      local_98 = StringRef::end((StringRef *)local_198);
      local_98 = local_98 + -(long)local_188;
      local_a0 = local_190;
      local_a8 = local_188;
      if (local_188 == (char *)0x0) {
        local_8c = 0;
      }
      else {
        local_8c = memcmp(local_98,local_190,(size_t)local_188);
      }
      bVar7 = local_8c == 0;
    }
    if (bVar7) {
      local_220 = &Error.Length;
      local_230 = A.Data + -2;
      local_228 = 0;
      local_1a0 = local_220;
      puVar4 = std::min<unsigned_long>(&local_228,(unsigned_long *)&A);
      local_228 = *puVar4;
      sVar6 = Error.Length + local_228;
      local_238 = (long)A.Data - local_228;
      puVar4 = std::min<unsigned_long>((unsigned_long *)&local_230,&local_238);
      local_4b8 = (char *)*puVar4;
      local_138 = local_218;
      local_4c0 = sVar6;
      Error.Length = sVar6;
      A.Data = local_4b8;
      local_148 = local_4b8;
      local_140 = sVar6;
    }
  }
  if (A.Length != 0xffffffffffffffff) {
    local_250 = &Error.Length;
    local_258 = A.Length;
    local_268[1] = 0xffffffffffffffff;
    puVar4 = std::min<unsigned_long>(&local_258,(unsigned_long *)&A);
    local_258 = *puVar4;
    sVar6 = Error.Length + local_258;
    local_268[0] = (long)A.Data - local_258;
    puVar4 = std::min<unsigned_long>(local_268 + 1,local_268);
    local_4c8 = (char *)*puVar4;
    local_120 = local_248;
    local_4d0 = sVar6;
    Error.Length = sVar6;
    A.Data = local_4c8;
    local_130 = local_4c8;
    local_128 = sVar6;
  }
  local_180 = &Error.Length;
  Arch_local.Length = (size_t)this;
  if (A.Data == (char *)0x0) goto LAB_002ac005;
  if (A.Length != 0xffffffffffffffff) {
    local_1a8 = &Error.Length;
    if ((char *)0x1 < A.Data) {
      cVar2 = StringRef::operator[]((StringRef *)&Error.Length,0);
      if (cVar2 == 'v') {
        cVar2 = StringRef::operator[]((StringRef *)&Error.Length,1);
        iVar3 = isdigit((int)cVar2);
        if (iVar3 != 0) goto LAB_002abf32;
      }
      Arch_local.Length = (size_t)local_410;
      local_3d0 = Error.Data;
      goto LAB_002ac005;
    }
LAB_002abf32:
    local_2d0 = &local_4e0;
    local_2d8 = "eb";
    strlen("eb");
    sVar6 = StringRef::find((StringRef *)&Error.Length,local_4e0,0);
    if (sVar6 != 0xffffffffffffffff) {
      Arch_local.Length = (size_t)local_410;
      local_3d0 = Error.Data;
      goto LAB_002ac005;
    }
  }
  Arch_local.Length = Error.Length;
  local_3d0 = A.Data;
LAB_002ac005:
  SVar1.Length = (size_t)local_3d0;
  SVar1.Data = (char *)Arch_local.Length;
  return SVar1;
}

Assistant:

StringRef llvm::ARM::getCanonicalArchName(StringRef Arch) {
  size_t offset = StringRef::npos;
  StringRef A = Arch;
  StringRef Error = "";

  // Begins with "arm" / "thumb", move past it.
  if (A.startswith("arm64"))
    offset = 5;
  else if (A.startswith("arm"))
    offset = 3;
  else if (A.startswith("thumb"))
    offset = 5;
  else if (A.startswith("aarch64")) {
    offset = 7;
    // AArch64 uses "_be", not "eb" suffix.
    if (A.find("eb") != StringRef::npos)
      return Error;
    if (A.substr(offset, 3) == "_be")
      offset += 3;
  }

  // Ex. "armebv7", move past the "eb".
  if (offset != StringRef::npos && A.substr(offset, 2) == "eb")
    offset += 2;
  // Or, if it ends with eb ("armv7eb"), chop it off.
  else if (A.endswith("eb"))
    A = A.substr(0, A.size() - 2);
  // Trim the head
  if (offset != StringRef::npos)
    A = A.substr(offset);

  // Empty string means offset reached the end, which means it's valid.
  if (A.empty())
    return Arch;

  // Only match non-marketing names
  if (offset != StringRef::npos) {
    // Must start with 'vN'.
    if (A.size() >= 2 && (A[0] != 'v' || !std::isdigit(A[1])))
      return Error;
    // Can't have an extra 'eb'.
    if (A.find("eb") != StringRef::npos)
      return Error;
  }

  // Arch will either be a 'v' name (v7a) or a marketing name (xscale).
  return A;
}